

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeTriang>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int iVar1;
  TPZManVector<int,_27> *this;
  int *piVar2;
  int64_t iVar3;
  TPZManVector<int,_27> *pTVar4;
  long in_RCX;
  TPZVec<int> *in_RSI;
  int i_1;
  int maxOrder;
  int size;
  int order;
  int i;
  int nShape;
  TPZManVector<int,_27> scalarOrders;
  int scalarorder;
  int ncon;
  TPZShapeData *in_stack_000004d0;
  undefined8 in_stack_fffffffffffffd68;
  TPZManVector<int,_27> *in_stack_fffffffffffffd70;
  TPZManVector<int,_27> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int64_t in_stack_fffffffffffffd98;
  TPZManVector<int,_27> *in_stack_fffffffffffffda0;
  TPZVec<long> *in_stack_fffffffffffffda8;
  TPZVec<int> *copy;
  TPZManVector<long,_8> *in_stack_fffffffffffffdb0;
  int local_240;
  int local_230;
  int64_t in_stack_fffffffffffffdd8;
  TPZManVector<std::pair<int,_long>,_60> *in_stack_fffffffffffffde0;
  TPZVec<int> local_198;
  TPZShapeData *in_stack_fffffffffffffe90;
  TPZVec<int> *in_stack_fffffffffffffe98;
  TPZVec<long> *in_stack_fffffffffffffea0;
  TPZShapeData *in_stack_fffffffffffffeb0;
  TPZManVector<int,_27> local_100;
  long local_20;
  TPZVec<int> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  TPZManVector<long,_8>::TPZManVector(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  TPZManVector<long,_8>::operator=
            ((TPZManVector<long,_8> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (TPZManVector<long,_8> *)in_stack_fffffffffffffd88);
  TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffffd70);
  pTVar4 = &local_100;
  TPZManVector<int,_20>::TPZManVector
            ((TPZManVector<int,_20> *)pTVar4,(TPZVec<int> *)in_stack_fffffffffffffda8);
  TPZManVector<int,_20>::operator=
            ((TPZManVector<int,_20> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (TPZManVector<int,_20> *)in_stack_fffffffffffffd88);
  TPZManVector<int,_20>::~TPZManVector((TPZManVector<int,_20> *)in_stack_fffffffffffffd70);
  TPZVec<int>::operator[](local_10,3);
  copy = &local_198;
  TPZManVector<int,_27>::TPZManVector
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (int *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  TPZShapeH1<pzshape::TPZShapeTriang>::Initialize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  this = (TPZManVector<int,_27> *)TPZVec<int>::size(local_10);
  if (this != (TPZManVector<int,_27> *)0x4) {
    pzinternal::DebugStopImpl(_scalarorder,scalarOrders._136_8_);
  }
  TPZManVector<int,_27>::TPZManVector(pTVar4,copy);
  TPZManVector<int,_27>::operator=
            ((TPZManVector<int,_27> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88);
  TPZManVector<int,_27>::~TPZManVector(in_stack_fffffffffffffd70);
  TPZManVector<int,_27>::Resize(this,in_stack_fffffffffffffd98);
  for (local_230 = 0; local_230 < 4; local_230 = local_230 + 1) {
    TPZVec<int>::operator[]((TPZVec<int> *)(local_20 + 0x2b50),(long)local_230);
    iVar1 = ComputeNConnectShapeF
                      ((int)in_stack_fffffffffffffd70,
                       (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(local_20 + 0x2be0),(long)local_230);
    *piVar2 = iVar1;
    TPZVec<int>::operator[]((TPZVec<int> *)(local_20 + 0x2be0),(long)local_230);
  }
  TPZManVector<std::pair<int,_long>,_60>::Resize
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  ComputeMasterDirections(in_stack_fffffffffffffeb0);
  ComputeVecandShape(in_stack_000004d0);
  iVar3 = TPZVec<int>::size((TPZVec<int> *)(local_20 + 0x2b50));
  pTVar4 = (TPZManVector<int,_27> *)
           TPZVec<int>::operator[]((TPZVec<int> *)(local_20 + 0x2b50),(long)((int)iVar3 + -1));
  iVar1 = *(int *)&(pTVar4->super_TPZVec<int>)._vptr_TPZVec;
  for (local_240 = 0; local_240 < (int)iVar3 + -1; local_240 = local_240 + 1) {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(local_20 + 0x2b50),(long)local_240);
    if (iVar1 < *piVar2) {
      pzinternal::DebugStopImpl(_scalarorder,scalarOrders._136_8_);
    }
  }
  TPZManVector<int,_27>::~TPZManVector(pTVar4);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}